

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::echo(TestMoreStuffImpl *this,EchoContext context)

{
  ClientHook *pCVar1;
  long *in_RDX;
  Reader params;
  Builder result;
  SegmentBuilder *local_e0;
  Own<capnp::ClientHook,_std::nullptr_t> OStack_d8;
  PointerBuilder local_c8;
  int iStack_b0;
  undefined4 uStack_ac;
  StructReader local_a8;
  StructBuilder local_78;
  undefined1 local_48;
  undefined7 uStack_47;
  ClientHook *pCStack_40;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  (**(code **)*in_RDX)(&local_c8);
  local_78.pointers = (WirePointer *)CONCAT44(uStack_ac,iStack_b0);
  local_78.data = local_c8.pointer;
  local_78.segment = local_c8.segment;
  local_78.capTable = local_c8.capTable;
  PointerReader::getStruct(&local_a8,(PointerReader *)&local_78,(word *)0x0);
  local_48 = 0;
  (**(code **)(*in_RDX + 0x10))(&local_e0);
  local_c8.pointer = (WirePointer *)OStack_d8.ptr;
  local_c8.segment = local_e0;
  local_c8.capTable = (CapTableBuilder *)OStack_d8.disposer;
  PointerBuilder::getStruct(&local_78,&local_c8,(StructSize)0x10000,(word *)0x0);
  if (local_a8.pointerCount == 0) {
    local_a8.nestingLimit = 0x7fffffff;
    local_a8.pointers = (WirePointer *)0x0;
    local_a8.segment = (SegmentReader *)0x0;
    local_a8.capTable = (CapTableReader *)0x0;
  }
  local_c8.segment = (SegmentBuilder *)local_a8.segment;
  local_c8.capTable = (CapTableBuilder *)local_a8.capTable;
  local_c8.pointer = local_a8.pointers;
  iStack_b0 = local_a8.nestingLimit;
  PointerReader::getCapability((PointerReader *)&local_48);
  OStack_d8.disposer = (Disposer *)CONCAT71(uStack_47,local_48);
  OStack_d8.ptr = pCStack_40;
  local_e0 = (SegmentBuilder *)capnproto_test::capnp::test::TestHandle::Client::vtable;
  local_c8.segment = local_78.segment;
  local_c8.capTable = local_78.capTable;
  local_c8.pointer = local_78.pointers;
  PointerBuilder::setCapability(&local_c8,&OStack_d8);
  pCVar1 = OStack_d8.ptr;
  if (OStack_d8.ptr != (ClientHook *)0x0) {
    OStack_d8.ptr = (ClientHook *)0x0;
    (**(OStack_d8.disposer)->_vptr_Disposer)
              (OStack_d8.disposer,pCVar1->_vptr_ClientHook[-2] + (long)&pCVar1->_vptr_ClientHook);
  }
  kj::_::readyNow();
  *(SegmentBuilder **)&this->super_Server = local_c8.segment;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::echo(EchoContext context) {
  ++callCount;
  auto params = context.getParams();
  auto result = context.getResults();
  result.setCap(params.getCap());
  return kj::READY_NOW;
}